

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void error<char>(char *fmtstr,char *args)

{
  String local_50;
  String local_30;
  
  String::String(&local_30,fmtstr);
  format<char>(&local_50,&local_30,args);
  error(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}